

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

void __thiscall ipx::Basis::ConstructBasisFromWeights(Basis *this,double *colscale,Info *info)

{
  int iVar1;
  Control *this_00;
  ostream *poVar2;
  string *psVar3;
  double dVar4;
  string local_88;
  string local_68;
  string local_48;
  
  (info->super_ipx_info).errflag = 0;
  (info->super_ipx_info).dependent_rows = 0;
  (info->super_ipx_info).dependent_cols = 0;
  if ((this->control_->parameters_).super_ipx_parameters.crash_basis != 0) {
    CrashBasis(this,colscale);
    dVar4 = MinSingularValue(this);
    poVar2 = Control::Debug(this->control_,1);
    psVar3 = &local_68;
    Textline<char[39]>(psVar3,(char (*) [39])"Minimum singular value of crash basis:");
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    sci2_abi_cxx11_(&local_88,(ipx *)psVar3,dVar4);
    poVar2 = std::operator<<(poVar2,(string *)&local_88);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    Repair(this,info);
    iVar1 = (info->super_ipx_info).basis_repairs;
    if (-1 < iVar1) {
      if (iVar1 != 0) {
        dVar4 = MinSingularValue(this);
        poVar2 = Control::Debug(this->control_,1);
        psVar3 = &local_68;
        Textline<char[48]>(psVar3,(char (*) [48])"Minimum singular value of repaired crash basis:");
        poVar2 = std::operator<<(poVar2,(string *)psVar3);
        sci2_abi_cxx11_(&local_88,(ipx *)psVar3,dVar4);
        poVar2 = std::operator<<(poVar2,(string *)&local_88);
        std::operator<<(poVar2,'\n');
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_68);
      }
      goto LAB_00372443;
    }
    this_00 = this->control_;
    std::__cxx11::string::string
              ((string *)&local_48," discarding crash basis\n",(allocator *)&local_68);
    Control::hLog(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  SetToSlackBasis(this);
LAB_00372443:
  PivotFreeVariablesIntoBasis(this,colscale,info);
  if ((info->super_ipx_info).errflag == 0) {
    PivotFixedVariablesOutOfBasis(this,colscale,info);
  }
  return;
}

Assistant:

void Basis::ConstructBasisFromWeights(const double* colscale, Info* info) {
    assert(colscale);
    info->errflag = 0;
    info->dependent_rows = 0;
    info->dependent_cols = 0;

    if (control_.crash_basis()) {
        CrashBasis(colscale);
        double sigma = MinSingularValue();
        control_.Debug()
            << Textline("Minimum singular value of crash basis:") << sci2(sigma)
            << '\n';
        Repair(info);
        if (info->basis_repairs < 0) {
	  control_.hLog(" discarding crash basis\n");
            SetToSlackBasis();
        }
        else if (info->basis_repairs > 0) {
            sigma = MinSingularValue();
            control_.Debug()
                << Textline("Minimum singular value of repaired crash basis:")
                << sci2(sigma) << '\n';
        }
    } else {
        SetToSlackBasis();
    }
    PivotFreeVariablesIntoBasis(colscale, info);
    if (info->errflag)
        return;
    PivotFixedVariablesOutOfBasis(colscale, info);
    if (info->errflag)
        return;
}